

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

TestCaseGroup * vkt::shaderexecutor::createFuncGroup(PrecisionTestContext *ctx,CaseFactory *factory)

{
  ShaderType shaderType;
  int iVar1;
  TestContext *pTVar2;
  FloatFormat *pFVar3;
  FloatFormat *pFVar4;
  pointer pSVar5;
  TestNode *node;
  TestNode *this;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  UniqueBase<tcu::TestNode,_de::DefaultDeleter<tcu::TestNode>_> local_128;
  string precName;
  string name;
  string shaderName;
  CaseContext caseCtx;
  
  this = (TestNode *)operator_new(0x70);
  pTVar2 = ctx->testCtx;
  (*factory->_vptr_CaseFactory[3])(&caseCtx,factory);
  (*factory->_vptr_CaseFactory[4])(&precName,factory);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,pTVar2,caseCtx.name._M_dataplus._M_p,precName._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&precName);
  std::__cxx11::string::~string((string *)&caseCtx);
  for (lVar8 = 1; lVar8 != 3; lVar8 = lVar8 + 1) {
    pcVar6 = glu::getPrecisionName((Precision)lVar8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&precName,pcVar6,(allocator<char> *)&caseCtx);
    pFVar3 = ctx->formats[lVar8];
    pFVar4 = ctx->formats[2];
    uVar7 = 0;
    while( true ) {
      pSVar5 = (ctx->shaderTypes).
               super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(ctx->shaderTypes).
                        super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pSVar5 >> 2) <= uVar7)
      break;
      shaderType = pSVar5[uVar7];
      pcVar6 = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&shaderName,pcVar6,(allocator<char> *)&caseCtx);
      std::operator+(&caseCtx.name,&precName,"_");
      std::operator+(&name,&caseCtx.name,&shaderName);
      std::__cxx11::string::~string((string *)&caseCtx);
      pTVar2 = ctx->testCtx;
      iVar1 = ctx->numRandoms;
      std::__cxx11::string::string((string *)&caseCtx,(string *)&name);
      caseCtx.floatFormat.m_maxValue = pFVar3->m_maxValue;
      caseCtx.floatFormat.m_minExp = pFVar3->m_minExp;
      caseCtx.floatFormat.m_maxExp = pFVar3->m_maxExp;
      caseCtx.floatFormat.m_fractionBits = pFVar3->m_fractionBits;
      caseCtx.floatFormat.m_hasSubnormal = pFVar3->m_hasSubnormal;
      caseCtx.floatFormat.m_hasInf = pFVar3->m_hasInf;
      caseCtx.floatFormat.m_hasNaN = pFVar3->m_hasNaN;
      caseCtx.floatFormat.m_exactPrecision = pFVar3->m_exactPrecision;
      caseCtx.floatFormat._25_7_ = *(undefined7 *)&pFVar3->field_0x19;
      caseCtx.highpFormat.m_maxValue = pFVar4->m_maxValue;
      caseCtx.highpFormat.m_minExp = pFVar4->m_minExp;
      caseCtx.highpFormat.m_maxExp = pFVar4->m_maxExp;
      caseCtx.highpFormat.m_fractionBits = pFVar4->m_fractionBits;
      caseCtx.highpFormat.m_hasSubnormal = pFVar4->m_hasSubnormal;
      caseCtx.highpFormat.m_hasInf = pFVar4->m_hasInf;
      caseCtx.highpFormat.m_hasNaN = pFVar4->m_hasNaN;
      caseCtx.highpFormat.m_exactPrecision = pFVar4->m_exactPrecision;
      caseCtx.highpFormat._25_3_ = *(undefined3 *)&pFVar4->field_0x19;
      caseCtx.highpFormat._28_4_ = *(undefined4 *)&pFVar4->field_0x1c;
      caseCtx.testContext = pTVar2;
      caseCtx.precision = (Precision)lVar8;
      caseCtx.shaderType = shaderType;
      caseCtx.numRandoms = (long)iVar1;
      (*factory->_vptr_CaseFactory[2])(&local_128,factory,&caseCtx);
      node = local_128.m_data.ptr;
      local_128.m_data.ptr = (TestNode *)0x0;
      tcu::TestNode::addChild(this,node);
      de::details::UniqueBase<tcu::TestNode,_de::DefaultDeleter<tcu::TestNode>_>::~UniqueBase
                (&local_128);
      std::__cxx11::string::~string((string *)&caseCtx);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::~string((string *)&shaderName);
      uVar7 = uVar7 + 1;
    }
    std::__cxx11::string::~string((string *)&precName);
  }
  return (TestCaseGroup *)this;
}

Assistant:

TestCaseGroup* createFuncGroup (const PrecisionTestContext&	ctx, const CaseFactory& factory)
{
	TestCaseGroup* const	group	= new TestCaseGroup(ctx.testCtx, factory.getName().c_str(), factory.getDesc().c_str());

	for (int precNdx = glu::PRECISION_MEDIUMP; precNdx < glu::PRECISION_LAST; ++precNdx)
	{
		const Precision		precision	= Precision(precNdx);
		const string		precName	(glu::getPrecisionName(precision));
		const FloatFormat&	fmt			= *de::getSizedArrayElement<glu::PRECISION_LAST>(ctx.formats, precNdx);
		const FloatFormat&	highpFmt	= *de::getSizedArrayElement<glu::PRECISION_LAST>(ctx.formats,
																						 glu::PRECISION_HIGHP);

		for (size_t shaderNdx = 0; shaderNdx < ctx.shaderTypes.size(); ++shaderNdx)
		{
			const ShaderType	shaderType	= ctx.shaderTypes[shaderNdx];
			const string		shaderName	(glu::getShaderTypeName(shaderType));
			const string		name		= precName + "_" + shaderName;
			const CaseContext	caseCtx		(name, ctx.testCtx, fmt, highpFmt,
											 precision, shaderType, ctx.numRandoms);

			group->addChild(factory.createCase(caseCtx).release());
		}
	}

	return group;
}